

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmValue.h
# Opt level: O1

bool __thiscall
cmLocalGenerator::AllAppleArchSysrootsAreTheSame
          (cmLocalGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *archs,cmValue sysroot)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  long lVar3;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  cmLocalGenerator *local_38;
  string *local_30;
  
  if (sysroot.Value == (string *)0x0) {
    return false;
  }
  __it._M_current =
       (archs->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (archs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  lVar3 = (long)pbVar1 - (long)__it._M_current >> 7;
  local_38 = this;
  local_30 = sysroot.Value;
  if (0 < lVar3) {
    lVar3 = lVar3 + 1;
    do {
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_38,__it);
      _Var4._M_current = __it._M_current;
      if (bVar2) goto LAB_0026cfef;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_38,__it._M_current + 1);
      _Var4._M_current = __it._M_current + 1;
      if (bVar2) goto LAB_0026cfef;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_38,__it._M_current + 2);
      _Var4._M_current = __it._M_current + 2;
      if (bVar2) goto LAB_0026cfef;
      bVar2 = __gnu_cxx::__ops::
              _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
              ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                            *)&local_38,__it._M_current + 3);
      _Var4._M_current = __it._M_current + 3;
      if (bVar2) goto LAB_0026cfef;
      __it._M_current = __it._M_current + 4;
      lVar3 = lVar3 + -1;
    } while (1 < lVar3);
  }
  lVar3 = (long)pbVar1 - (long)__it._M_current >> 5;
  if (lVar3 != 1) {
    if (lVar3 != 2) {
      _Var4._M_current = pbVar1;
      if ((lVar3 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
                  ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                                *)&local_38,__it), _Var4._M_current = __it._M_current, bVar2))
      goto LAB_0026cfef;
      __it._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
            ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                          *)&local_38,__it);
    _Var4._M_current = __it._M_current;
    if (bVar2) goto LAB_0026cfef;
    __it._M_current = __it._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::$_0>
          ::operator()((_Iter_negate<cmLocalGenerator::AllAppleArchSysrootsAreTheSame(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmValue)::__0>
                        *)&local_38,__it);
  _Var4._M_current = __it._M_current;
  if (!bVar2) {
    _Var4._M_current = pbVar1;
  }
LAB_0026cfef:
  return _Var4._M_current == pbVar1;
}

Assistant:

explicit operator bool() const noexcept { return this->Value != nullptr; }